

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bool __thiscall phaeton::TensorDataType::operator==(TensorDataType *this,TensorDataType *RHS)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint local_24;
  uint i;
  TensorDataType *RHS_local;
  TensorDataType *this_local;
  
  iVar1 = getRank(this);
  iVar2 = getRank(RHS);
  if (iVar1 == iVar2) {
    for (local_24 = 0; uVar3 = getRank(this), local_24 < uVar3; local_24 = local_24 + 1) {
      iVar1 = getDim(this,local_24);
      iVar2 = getDim(RHS,local_24);
      if (iVar1 != iVar2) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TensorDataType::operator==(const TensorDataType &RHS) const {
  if (getRank() != RHS.getRank()) {
    return false;
  }

  for (unsigned i = 0; i < getRank(); ++i) {
    if (getDim(i) != RHS.getDim(i)) {
      return false;
    }
  }

  return true;
}